

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O1

bool __thiscall sfc::Tile::operator==(Tile *this,Tile *other)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  bool bVar3;
  int iVar4;
  size_t __n;
  __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __it;
  __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __it_00;
  long lVar5;
  __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  _Var6;
  Tile *local_38;
  
  __s1 = (other->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (other->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar1 - (long)__s1;
  __s2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (__n == (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
    if (puVar1 == __s1) {
      return true;
    }
    iVar4 = bcmp(__s1,__s2,__n);
    if (iVar4 == 0) {
      return true;
    }
  }
  __it._M_current =
       (this->_mirrors).
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->_mirrors).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__it._M_current == pvVar2) {
    return false;
  }
  lVar5 = ((long)pvVar2 - (long)__it._M_current >> 3) * -0x5555555555555555 >> 2;
  __it_00._M_current = __it._M_current;
  local_38 = other;
  if (0 < lVar5) {
    __it_00._M_current = __it._M_current + lVar5 * 4;
    lVar5 = lVar5 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_pred<sfc::Tile::operator==(sfc::Tile_const&)const::$_0>::
              operator()((_Iter_pred<sfc::Tile::operator__(sfc::Tile_const&)const::__0> *)&local_38,
                         __it);
      _Var6._M_current = __it._M_current;
      if (bVar3) goto LAB_00156068;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<sfc::Tile::operator==(sfc::Tile_const&)const::$_0>::
              operator()((_Iter_pred<sfc::Tile::operator__(sfc::Tile_const&)const::__0> *)&local_38,
                         __it._M_current + 1);
      _Var6._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_00156068;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<sfc::Tile::operator==(sfc::Tile_const&)const::$_0>::
              operator()((_Iter_pred<sfc::Tile::operator__(sfc::Tile_const&)const::__0> *)&local_38,
                         __it._M_current + 2);
      _Var6._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_00156068;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<sfc::Tile::operator==(sfc::Tile_const&)const::$_0>::
              operator()((_Iter_pred<sfc::Tile::operator__(sfc::Tile_const&)const::__0> *)&local_38,
                         __it._M_current + 3);
      _Var6._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_00156068;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = ((long)pvVar2 - (long)__it_00._M_current >> 3) * -0x5555555555555555;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = pvVar2;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::_Iter_pred<sfc::Tile::operator==(sfc::Tile_const&)const::$_0>::
                  operator()((_Iter_pred<sfc::Tile::operator__(sfc::Tile_const&)const::__0> *)
                             &local_38,__it_00), _Var6._M_current = __it_00._M_current, bVar3))
      goto LAB_00156068;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::_Iter_pred<sfc::Tile::operator==(sfc::Tile_const&)const::$_0>::
            operator()((_Iter_pred<sfc::Tile::operator__(sfc::Tile_const&)const::__0> *)&local_38,
                       __it_00);
    _Var6._M_current = __it_00._M_current;
    if (bVar3) goto LAB_00156068;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_pred<sfc::Tile::operator==(sfc::Tile_const&)const::$_0>::
          operator()((_Iter_pred<sfc::Tile::operator__(sfc::Tile_const&)const::__0> *)&local_38,
                     __it_00);
  _Var6._M_current = __it_00._M_current;
  if (!bVar3) {
    _Var6._M_current = pvVar2;
  }
LAB_00156068:
  return _Var6._M_current != pvVar2;
}

Assistant:

bool Tile::operator==(const Tile& other) const {
  if (other._data == _data)
    return true;
  if (!_mirrors.empty()) {
    return std::any_of(_mirrors.begin(), _mirrors.end(), [&](const auto& m) { return m == other._data; });
  }
  return false;
}